

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v9::basic_format_parse_context<char,_fmt::v9::detail::error_handler>::next_arg_id
          (basic_format_parse_context<char,_fmt::v9::detail::error_handler> *this)

{
  basic_format_parse_context<char,_fmt::v9::detail::error_handler> *in_RDI;
  int id;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI->next_arg_id_ < 0) {
    on_error(in_RDI,in_stack_ffffffffffffffd8);
    local_4 = 0;
  }
  else {
    local_4 = in_RDI->next_arg_id_;
    in_RDI->next_arg_id_ = local_4 + 1;
    do_check_arg_id(in_RDI,local_4);
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR auto next_arg_id() -> int {
    if (next_arg_id_ < 0) {
      on_error("cannot switch from manual to automatic argument indexing");
      return 0;
    }
    int id = next_arg_id_++;
    do_check_arg_id(id);
    return id;
  }